

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

Option * __thiscall CLI::Option::multi_option_policy(Option *this,MultiOptionPolicy value)

{
  IncorrectConstruction *__return_storage_ptr__;
  string sStack_38;
  
  if ((uint)this->expected_ < 2) {
    (this->super_OptionBase<CLI::Option>).multi_option_policy_ = value;
    return this;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  single_name_abi_cxx11_(&sStack_38,this);
  IncorrectConstruction::MultiOptionPolicy(__return_storage_ptr__,&sStack_38);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *multi_option_policy(MultiOptionPolicy value = MultiOptionPolicy::Throw) {
        if(get_expected() != 0 && get_expected() != 1)
            throw IncorrectConstruction::MultiOptionPolicy(single_name());
        multi_option_policy_ = value;
        return this;
    }